

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall kj::_::Coroutine<void>::fulfill(Coroutine<void> *this,FixVoid<void> *value)

{
  ExceptionOr<kj::_::Void> local_1a8;
  
  if ((this->super_CoroutineBase).waiting == true) {
    local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1a8.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=(&this->result,&local_1a8);
    if (local_1a8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1a8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_CoroutineBase).onReadyEvent);
    (this->super_CoroutineBase).waiting = false;
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }